

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ops_sse.h
# Opt level: O1

void helper_psadbw_mmx_x86_64(CPUX86State *env,MMXReg *d,MMXReg *s)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  MMXReg MVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  
  uVar2 = (uint)d->_b_MMXReg[0] - (uint)s->_b_MMXReg[0];
  uVar1 = -uVar2;
  if (0 < (int)uVar2) {
    uVar1 = uVar2;
  }
  uVar9 = (uint)d->_b_MMXReg[1] - (uint)s->_b_MMXReg[1];
  uVar2 = -uVar9;
  if (0 < (int)uVar9) {
    uVar2 = uVar9;
  }
  uVar3 = (uint)d->_b_MMXReg[2] - (uint)s->_b_MMXReg[2];
  uVar9 = -uVar3;
  if (0 < (int)uVar3) {
    uVar9 = uVar3;
  }
  uVar10 = (uint)d->_b_MMXReg[3] - (uint)s->_b_MMXReg[3];
  uVar3 = -uVar10;
  if (0 < (int)uVar10) {
    uVar3 = uVar10;
  }
  uVar6 = (uint)d->_b_MMXReg[4] - (uint)s->_b_MMXReg[4];
  uVar10 = -uVar6;
  if (0 < (int)uVar6) {
    uVar10 = uVar6;
  }
  uVar7 = (uint)d->_b_MMXReg[5] - (uint)s->_b_MMXReg[5];
  uVar6 = -uVar7;
  if (0 < (int)uVar7) {
    uVar6 = uVar7;
  }
  uVar8 = (uint)d->_b_MMXReg[6] - (uint)s->_b_MMXReg[6];
  uVar7 = -uVar8;
  if (0 < (int)uVar8) {
    uVar7 = uVar8;
  }
  uVar4 = (uint)d->_b_MMXReg[7] - (uint)s->_b_MMXReg[7];
  uVar8 = -uVar4;
  if (0 < (int)uVar4) {
    uVar8 = uVar4;
  }
  MVar5._0_4_ = (uVar8 & 0xff) +
                (uVar7 & 0xff) + (uVar6 & 0xff) + (uVar10 & 0xff) +
                (uVar3 & 0xff) + (uVar9 & 0xff) + (uVar2 & 0xff) + (uVar1 & 0xff);
  MVar5._l_MMXReg[1] = 0;
  *d = MVar5;
  return;
}

Assistant:

void glue(helper_psadbw, SUFFIX)(CPUX86State *env, Reg *d, Reg *s)
{
    unsigned int val;

    val = 0;
    val += abs1(d->B(0) - s->B(0));
    val += abs1(d->B(1) - s->B(1));
    val += abs1(d->B(2) - s->B(2));
    val += abs1(d->B(3) - s->B(3));
    val += abs1(d->B(4) - s->B(4));
    val += abs1(d->B(5) - s->B(5));
    val += abs1(d->B(6) - s->B(6));
    val += abs1(d->B(7) - s->B(7));
    d->Q(0) = val;
#if SHIFT == 1
    val = 0;
    val += abs1(d->B(8) - s->B(8));
    val += abs1(d->B(9) - s->B(9));
    val += abs1(d->B(10) - s->B(10));
    val += abs1(d->B(11) - s->B(11));
    val += abs1(d->B(12) - s->B(12));
    val += abs1(d->B(13) - s->B(13));
    val += abs1(d->B(14) - s->B(14));
    val += abs1(d->B(15) - s->B(15));
    d->Q(1) = val;
#endif
}